

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* CLI::detail::get_names
            (tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *input,bool allow_non_standard)

{
  byte bVar1;
  pointer pbVar2;
  pointer pcVar3;
  _Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
  *p_Var4;
  int iVar5;
  BadNameString *pBVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  pointer pbVar8;
  string pos_name;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  short_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  long_names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  value_type local_1a0;
  undefined4 local_17c;
  int local_178;
  undefined4 uStack_174;
  long local_168 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  _Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
  *local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_17c = (undefined4)CONCAT71(in_register_00000011,allow_non_standard);
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  local_1c0._M_string_length = 0;
  local_1c0.field_2._M_local_buf[0] = '\0';
  pbVar8 = (input->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (input->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_118 = (_Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
               *)__return_storage_ptr__;
  if (pbVar8 != pbVar2) {
    do {
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      pcVar3 = (pbVar8->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a0,pcVar3,pcVar3 + pbVar8->_M_string_length);
      if (local_1a0._M_string_length != 0) {
        if (local_1a0._M_string_length != 1) {
          if ((*local_1a0._M_dataplus._M_p == 0x2d) && (local_1a0._M_dataplus._M_p[1] != 0x2d)) {
            if (local_1a0._M_string_length == 2) {
              if ((byte)local_1a0._M_dataplus._M_p[1] < 0x22) {
                pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
                local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_90,local_1a0._M_dataplus._M_p,
                           local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
                BadNameString::OneCharName(pBVar6,&local_90);
                __cxa_throw(pBVar6,&BadNameString::typeinfo,Error::~Error);
              }
              local_178 = 1;
              ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<int,char&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_158,&local_178,local_1a0._M_dataplus._M_p + 1);
            }
            else {
              if ((char)local_17c == '\0') {
                pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
                local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_70,local_1a0._M_dataplus._M_p,
                           local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
                BadNameString::MissingDash(pBVar6,&local_70);
                __cxa_throw(pBVar6,&BadNameString::typeinfo,Error::~Error);
              }
              ::std::__cxx11::string::substr((ulong)&local_178,(ulong)&local_1a0);
              ::std::__cxx11::string::operator=((string *)&local_1a0,(string *)&local_178);
              if ((long *)CONCAT44(uStack_174,local_178) != local_168) {
                operator_delete((long *)CONCAT44(uStack_174,local_178),local_168[0] + 1);
              }
              if (((local_1a0._M_string_length == 0) || (*local_1a0._M_dataplus._M_p == 0x2d)) ||
                 ((byte)*local_1a0._M_dataplus._M_p < 0x22)) {
LAB_0013d528:
                pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
                local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_50,local_1a0._M_dataplus._M_p,
                           local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
                BadNameString::BadLongName(pBVar6,&local_50);
                __cxa_throw(pBVar6,&BadNameString::typeinfo,Error::~Error);
              }
              uVar7 = 1;
              while (local_1a0._M_string_length != uVar7) {
                bVar1 = local_1a0._M_dataplus._M_p[uVar7];
                if (((bVar1 == 0x3a) || (bVar1 == 0x3d)) ||
                   ((bVar1 == 0x7b || (uVar7 = uVar7 + 1, bVar1 != 9 && bVar1 < 0x21))))
                goto LAB_0013d528;
              }
              this = &local_158;
LAB_0013d3e9:
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(this,&local_1a0);
            }
            goto LAB_0013d20e;
          }
          if (2 < local_1a0._M_string_length) {
            ::std::__cxx11::string::substr((ulong)&local_178,(ulong)&local_1a0);
            iVar5 = ::std::__cxx11::string::compare((char *)&local_178);
            if ((long *)CONCAT44(uStack_174,local_178) != local_168) {
              operator_delete((long *)CONCAT44(uStack_174,local_178),local_168[0] + 1);
            }
            if (iVar5 == 0) {
              ::std::__cxx11::string::substr((ulong)&local_178,(ulong)&local_1a0);
              ::std::__cxx11::string::operator=((string *)&local_1a0,(string *)&local_178);
              if ((long *)CONCAT44(uStack_174,local_178) != local_168) {
                operator_delete((long *)CONCAT44(uStack_174,local_178),local_168[0] + 1);
              }
              if (((local_1a0._M_string_length == 0) || (*local_1a0._M_dataplus._M_p == 0x2d)) ||
                 ((byte)*local_1a0._M_dataplus._M_p < 0x22)) {
LAB_0013d4c4:
                pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
                local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_b0,local_1a0._M_dataplus._M_p,
                           local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
                BadNameString::BadLongName(pBVar6,&local_b0);
                __cxa_throw(pBVar6,&BadNameString::typeinfo,Error::~Error);
              }
              uVar7 = 1;
              while (local_1a0._M_string_length != uVar7) {
                bVar1 = local_1a0._M_dataplus._M_p[uVar7];
                if ((((bVar1 == 0x3a) || (bVar1 == 0x3d)) || (bVar1 == 0x7b)) ||
                   (uVar7 = uVar7 + 1, bVar1 != 9 && bVar1 < 0x21)) goto LAB_0013d4c4;
              }
              this = &local_138;
              goto LAB_0013d3e9;
            }
          }
        }
        iVar5 = ::std::__cxx11::string::compare((char *)&local_1a0);
        if (((iVar5 == 0) ||
            (iVar5 = ::std::__cxx11::string::compare((char *)&local_1a0), iVar5 == 0)) ||
           (iVar5 = ::std::__cxx11::string::compare((char *)&local_1a0), iVar5 == 0)) {
          pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,local_1a0._M_dataplus._M_p,
                     local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
          BadNameString::ReservedName(pBVar6,&local_d0);
          __cxa_throw(pBVar6,&BadNameString::typeinfo,Error::~Error);
        }
        if (local_1c0._M_string_length != 0) {
          pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,local_1a0._M_dataplus._M_p,
                     local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
          BadNameString::MultiPositionalNames(pBVar6,&local_f0);
          __cxa_throw(pBVar6,&BadNameString::typeinfo,Error::~Error);
        }
        if (((local_1a0._M_string_length == 0) || (*local_1a0._M_dataplus._M_p == 0x2d)) ||
           ((byte)*local_1a0._M_dataplus._M_p < 0x22)) {
LAB_0013d460:
          pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_110,local_1a0._M_dataplus._M_p,
                     local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
          BadNameString::BadPositionalName(pBVar6,&local_110);
          __cxa_throw(pBVar6,&BadNameString::typeinfo,Error::~Error);
        }
        uVar7 = 1;
        while (local_1a0._M_string_length != uVar7) {
          bVar1 = local_1a0._M_dataplus._M_p[uVar7];
          if ((((bVar1 == 0x3a) || (bVar1 == 0x3d)) || (bVar1 == 0x7b)) ||
             (uVar7 = uVar7 + 1, bVar1 != 9 && bVar1 < 0x21)) goto LAB_0013d460;
        }
        ::std::__cxx11::string::_M_assign((string *)&local_1c0);
      }
LAB_0013d20e:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar2);
  }
  p_Var4 = local_118;
  ::std::
  _Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
  ::
  _Tuple_impl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&,void>
            (local_118,&local_158,&local_138,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,
                    CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                             local_1c0.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_158);
  return (tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)p_Var4;
}

Assistant:

CLI11_INLINE std::tuple<std::vector<std::string>, std::vector<std::string>, std::string>
get_names(const std::vector<std::string> &input, bool allow_non_standard) {

    std::vector<std::string> short_names;
    std::vector<std::string> long_names;
    std::string pos_name;
    for(std::string name : input) {
        if(name.length() == 0) {
            continue;
        }
        if(name.length() > 1 && name[0] == '-' && name[1] != '-') {
            if(name.length() == 2 && valid_first_char(name[1])) {
                short_names.emplace_back(1, name[1]);
            } else if(name.length() > 2) {
                if(allow_non_standard) {
                    name = name.substr(1);
                    if(valid_name_string(name)) {
                        short_names.push_back(name);
                    } else {
                        throw BadNameString::BadLongName(name);
                    }
                } else {
                    throw BadNameString::MissingDash(name);
                }
            } else {
                throw BadNameString::OneCharName(name);
            }
        } else if(name.length() > 2 && name.substr(0, 2) == "--") {
            name = name.substr(2);
            if(valid_name_string(name)) {
                long_names.push_back(name);
            } else {
                throw BadNameString::BadLongName(name);
            }
        } else if(name == "-" || name == "--" || name == "++") {
            throw BadNameString::ReservedName(name);
        } else {
            if(!pos_name.empty()) {
                throw BadNameString::MultiPositionalNames(name);
            }
            if(valid_name_string(name)) {
                pos_name = name;
            } else {
                throw BadNameString::BadPositionalName(name);
            }
        }
    }
    return std::make_tuple(short_names, long_names, pos_name);
}